

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

BOOL __thiscall Memory::Recycler::TrackFree(Recycler *this,char *address,size_t size)

{
  code *pcVar1;
  bool bVar2;
  TrackerData *pTVar3;
  undefined4 *puVar4;
  char16_t *form;
  
  if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
    CCLock::Enter(&this->trackerCriticalSection->super_CCLock);
    pTVar3 = GetTrackerData(this,address);
    if (pTVar3 == (TrackerData *)0x0) {
      if (DAT_0145c441 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x207b,"(false)","false");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
    else {
      if (pTVar3 != &TrackerData::EmptyData) {
        pTVar3->FreeSize = pTVar3->FreeSize + size;
        pTVar3->FreeCount = pTVar3->FreeCount + 1;
        if (pTVar3->TraceLifetime == true) {
          form = L"Freed %S %p\n";
          if (pTVar3->isArray != false) {
            form = L"Freed %S[] %p\n";
          }
          Output::Print(form,*(char **)(pTVar3->typeinfo + 8) +
                             (**(char **)(pTVar3->typeinfo + 8) == '*'),address);
        }
      }
      SetTrackerData(this,address,(TrackerData *)0x0);
    }
    CCLock::Leave(&this->trackerCriticalSection->super_CCLock);
  }
  return 1;
}

Assistant:

BOOL Recycler::TrackFree(const char* address, size_t size)
{
    if (this->trackerDictionary != nullptr)
    {
        trackerCriticalSection->Enter();
        TrackerData * data = GetTrackerData((char *)address);
        if (data != nullptr)
        {
            if (data != &TrackerData::EmptyData)
            {
#ifdef PERF_COUNTERS
                --data->counter;
                data->sizeCounter -= size;
#endif
                if (data->typeinfo == &typeid(RecyclerWeakReferenceBase))
                {
                    TrackFreeWeakRef((RecyclerWeakReferenceBase *)address);
                }
                data->FreeSize += size;
                data->FreeCount++;
#ifdef TRACE_OBJECT_LIFETIME
                if (data->TraceLifetime)
                {
                    Output::Print(data->isArray ? _u("Freed %S[] %p\n") : _u("Freed %S %p\n"), data->typeinfo->name(), address);
                }
#endif
            }
            SetTrackerData((char *)address, nullptr);
        }
        else
        {
            if (!CONFIG_FLAG(KeepRecyclerTrackData))
            {
                Assert(false);
            }
        }
        trackerCriticalSection->Leave();
    }
    return true;
}